

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall capnp::compiler::Compiler::Node::loadFinalSchema(Node *this,SchemaLoader *loader)

{
  uint uVar1;
  NullableValue<kj::Exception> *other;
  Exception *pEVar2;
  ErrorReporter *pEVar3;
  Exception *params_1;
  Type *func;
  String local_338;
  ArrayPtr<const_char> local_320 [2];
  Content **local_300;
  Content *local_2f8;
  Node *local_2f0;
  Maybe<kj::Exception> local_2e8;
  undefined1 local_188 [8];
  NullableValue<kj::Exception> exception;
  Content *local_20;
  Content *content;
  SchemaLoader *loader_local;
  Node *this_local;
  
  content = (Content *)loader;
  loader_local = (SchemaLoader *)this;
  exception.field_1._336_8_ = getContent(this,FINISHED);
  local_20 = kj::_::readMaybe<capnp::compiler::Compiler::Node::Content>
                       ((Maybe<capnp::compiler::Compiler::Node::Content_&> *)
                        ((long)&exception.field_1 + 0x150));
  if (local_20 != (Content *)0x0) {
    local_300 = &local_20;
    local_2f8 = content;
    params_1 = (Exception *)content;
    local_2f0 = this;
    kj::
    runCatchingExceptions<capnp::compiler::Compiler::Node::loadFinalSchema(capnp::SchemaLoader_const&)::__0>
              (&local_2e8,(kj *)&local_300,func);
    other = kj::_::readMaybe<kj::Exception>(&local_2e8);
    kj::_::NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)local_188,other);
    kj::Maybe<kj::Exception>::~Maybe(&local_2e8);
    pEVar2 = kj::_::NullableValue::operator_cast_to_Exception_((NullableValue *)local_188);
    if (pEVar2 != (Exception *)0x0) {
      kj::Maybe<capnp::schema::Node::Reader>::operator=(&local_20->finalSchema,(void *)0x0);
      pEVar3 = CompiledModule::getErrorReporter(this->module);
      uVar1 = (*pEVar3->_vptr_ErrorReporter[1])();
      if ((uVar1 & 1) == 0) {
        pEVar2 = kj::_::NullableValue<kj::Exception>::operator*
                           ((NullableValue<kj::Exception> *)local_188);
        kj::str<char_const(&)[50],kj::Exception&>
                  (&local_338,(kj *)"Internal compiler bug: Schema failed validation:\n",
                   (char (*) [50])pEVar2,params_1);
        kj::StringPtr::StringPtr((StringPtr *)local_320,&local_338);
        addError(this,(StringPtr)local_320[0]);
        kj::String::~String(&local_338);
      }
    }
    kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_188);
  }
  return;
}

Assistant:

void Compiler::Node::loadFinalSchema(const SchemaLoader& loader) {
  KJ_IF_MAYBE(content, getContent(Content::FINISHED)) {
    KJ_IF_MAYBE(exception, kj::runCatchingExceptions([&](){
      KJ_IF_MAYBE(finalSchema, content->finalSchema) {
        KJ_MAP(auxSchema, content->auxSchemas) {
          return loader.loadOnce(auxSchema);
        };
        loadedFinalSchema = loader.loadOnce(*finalSchema).getProto();
      }
    })) {
      // Schema validation threw an exception.

      // Don't try loading this again.
      content->finalSchema = nullptr;

      // Only bother to report validation failures if we think we haven't seen any errors.
      // Otherwise we assume that the errors caused the validation failure.
      if (!module->getErrorReporter().hadErrors()) {
        addError(kj::str("Internal compiler bug: Schema failed validation:\n", *exception));
      }
    }
  }
}